

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot_light.cpp
# Opt level: O0

Light_SampleRes * embree::SpotLight_sample(Light *super,DifferentialGeometry *dg,Vec2f *s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  long lVar12;
  undefined8 uVar13;
  undefined8 *puVar14;
  long in_RDX;
  long in_RSI;
  Light_SampleRes *in_RDI;
  float fVar15;
  float angularAttenuation;
  float cosAngle;
  float invdist;
  float dist2;
  SpotLight *self;
  Light_SampleRes *res;
  __m128 c_1;
  __m128 r;
  __m128 a_1;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  vfloat4 c_2;
  vfloat4 b_1;
  vfloat4 a_2;
  float local_d80;
  float local_d7c;
  Light_SampleRes *pLVar16;
  undefined4 local_d3c;
  undefined4 local_d38;
  float local_d34;
  float local_d30;
  float local_d2c;
  undefined8 local_d28;
  undefined8 uStack_d20;
  float local_d10;
  float local_d0c;
  float local_d08;
  float local_d04;
  float local_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  long local_cc0;
  long local_cb0;
  undefined1 local_c98 [16];
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined1 local_c78 [16];
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined1 local_c58 [16];
  float *local_c48;
  undefined8 *local_c40;
  undefined8 *local_c38;
  undefined8 *local_c20;
  Vec3fa *local_c18;
  undefined8 *local_c10;
  Vec3fa *local_c08;
  undefined8 *local_c00;
  Vec3fa *local_bf8;
  undefined1 *local_bf0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  float local_b9c;
  Vec3fa *local_b98;
  undefined8 *local_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  Vec3fa *local_b78;
  undefined8 *local_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  Vec3fa *local_b50;
  Vec3fa *local_b48;
  float local_b3c;
  undefined8 *local_b38;
  undefined1 *local_b18;
  undefined1 *local_b08;
  undefined1 *local_af8;
  undefined8 *local_af0;
  undefined8 *local_ae8;
  undefined8 *local_ae0;
  ulong local_ad8;
  undefined8 uStack_ad0;
  undefined1 local_ac8 [16];
  ulong local_ab8;
  undefined8 uStack_ab0;
  float local_aa0;
  Vec3fa *local_a98;
  undefined8 *local_a90;
  undefined8 *local_a88;
  undefined4 *local_a78;
  undefined4 *local_a70;
  float *local_a68;
  float local_a60;
  float local_a5c;
  undefined1 *local_a58;
  undefined1 *local_a50;
  float local_a48;
  float local_a44;
  Vec3fa *local_a40;
  Vec3fa *local_a38;
  undefined8 *local_a30;
  Vec3fa *local_a28;
  undefined8 *local_a20;
  undefined8 *local_a18;
  undefined8 *local_a10;
  Vec3fa *local_a08;
  undefined8 *local_a00;
  undefined8 *local_9e0;
  undefined1 *local_9d8;
  undefined8 *local_9d0;
  undefined1 local_9c8 [16];
  undefined4 local_9ac;
  undefined1 local_9a8 [16];
  undefined4 local_98c;
  undefined1 local_988 [16];
  float local_96c;
  ulong local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  ulong local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  ulong local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  ulong local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  ulong local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 *local_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 *local_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 *local_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 *local_7a8;
  undefined8 *local_7a0;
  undefined8 *local_798;
  undefined8 *local_790;
  undefined8 *local_788;
  undefined8 *local_780;
  undefined8 *local_778;
  undefined8 *local_770;
  undefined8 *local_768;
  undefined8 *local_760;
  undefined8 *local_758;
  undefined8 *local_750;
  float local_748;
  float fStack_744;
  float fStack_740;
  float fStack_73c;
  undefined8 *local_738;
  undefined8 *local_730;
  undefined8 *local_728;
  undefined8 *local_720;
  float local_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  undefined8 *local_708;
  undefined8 *local_700;
  undefined8 *local_6f8;
  undefined8 *local_6f0;
  float local_6e8;
  float fStack_6e4;
  float fStack_6e0;
  float fStack_6dc;
  undefined8 *local_6d8;
  undefined8 *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  undefined8 *local_6a0;
  undefined8 *local_698;
  undefined8 *local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 *local_660;
  undefined8 *local_658;
  undefined8 *local_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 *local_630;
  float local_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  undefined8 *local_5b8;
  undefined8 *local_5b0;
  undefined8 *local_5a8;
  undefined8 *local_5a0;
  undefined8 *local_598;
  undefined8 *local_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 *local_570;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 *local_540;
  undefined8 *local_538;
  undefined8 *local_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 *local_510;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 *local_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_39c;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined8 *local_360;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 *local_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined8 *local_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 *local_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 *local_2c0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined8 *local_2a0;
  ulong local_298;
  undefined8 uStack_290;
  ulong local_288;
  undefined8 uStack_280;
  ulong local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined1 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined1 *local_178;
  undefined8 *local_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 *local_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined1 *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  undefined1 *local_98;
  undefined8 *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined8 *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  pLVar16 = in_RDI;
  local_cc0 = in_RSI;
  local_cb0 = in_RDX;
  Light_SampleRes::Light_SampleRes(in_RDI);
  lVar12 = local_cc0;
  local_ae8 = (undefined8 *)(local_cc0 + 0x10);
  local_af0 = (undefined8 *)(local_cb0 + 0x20);
  local_ae0 = &local_cd8;
  uVar1 = *local_ae8;
  uVar2 = *(undefined8 *)(local_cc0 + 0x18);
  uVar3 = *local_af0;
  uVar4 = *(undefined8 *)(local_cb0 + 0x28);
  local_388._0_4_ = (float)uVar1;
  local_388._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_380._0_4_ = (float)uVar2;
  uStack_380._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_398._0_4_ = (float)uVar3;
  local_398._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_390._0_4_ = (float)uVar4;
  uStack_390._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_2b8 = (float)local_388 - (float)local_398;
  fStack_2b4 = local_388._4_4_ - local_398._4_4_;
  fStack_2b0 = (float)uStack_380 - (float)uStack_390;
  fStack_2ac = uStack_380._4_4_ - uStack_390._4_4_;
  local_2a0 = &local_cd8;
  local_cd8 = CONCAT44(fStack_2b4,local_2b8);
  uStack_cd0 = CONCAT44(fStack_2ac,fStack_2b0);
  local_bf8 = &pLVar16->dir;
  local_c00 = &local_cd8;
  *(undefined8 *)&local_bf8->field_0 = local_cd8;
  *(undefined8 *)((long)&(pLVar16->dir).field_0 + 8) = uStack_cd0;
  local_398 = uVar3;
  uStack_390 = uVar4;
  local_388 = uVar1;
  uStack_380 = uVar2;
  if (0.0 < *(float *)(local_cc0 + 0x68)) {
    puVar14 = (undefined8 *)(local_cc0 + 0x20);
    uniformSampleDisk((float)((ulong)pLVar16 >> 0x20),(Vec2f *)in_RDI);
    local_c38 = &local_cf8;
    local_af8 = local_c58;
    local_b08 = local_c78;
    local_d0 = (undefined8 *)(lVar12 + 0x30);
    local_b18 = local_c98;
    local_9e0 = (undefined8 *)(lVar12 + 0x40);
    local_9d0 = &local_c88;
    local_9d8 = local_c98;
    uVar1 = *local_9e0;
    uVar2 = *(undefined8 *)(lVar12 + 0x48);
    local_268._0_4_ = (float)uVar1;
    local_268._4_4_ = (float)((ulong)uVar1 >> 0x20);
    uStack_260._0_4_ = (float)uVar2;
    uStack_260._4_4_ = (float)((ulong)uVar2 >> 0x20);
    local_378 = local_d00 * (float)local_268;
    fStack_374 = local_d00 * local_268._4_4_;
    fStack_370 = local_d00 * (float)uStack_260;
    fStack_36c = local_d00 * uStack_260._4_4_;
    local_360 = &local_c88;
    local_c0 = &local_c68;
    local_c8 = local_c78;
    local_d8 = &local_c88;
    local_90 = &local_e8;
    uVar3 = *local_d0;
    uVar4 = *(undefined8 *)(lVar12 + 0x38);
    local_28._0_4_ = (float)uVar3;
    local_28._4_4_ = (float)((ulong)uVar3 >> 0x20);
    uStack_20._0_4_ = (float)uVar4;
    uStack_20._4_4_ = (float)((ulong)uVar4 >> 0x20);
    local_68 = local_d04 * (float)local_28;
    fStack_64 = local_d04 * local_28._4_4_;
    fStack_60 = local_d04 * (float)uStack_20;
    fStack_5c = local_d04 * uStack_20._4_4_;
    local_50 = &local_e8;
    local_78 = CONCAT44(fStack_64,local_68);
    uStack_70 = CONCAT44(fStack_5c,fStack_60);
    local_a8 = &local_c68;
    local_b0 = &local_e8;
    local_88 = (float)local_c88;
    fStack_84 = (float)((ulong)local_c88 >> 0x20);
    fStack_80 = (float)uStack_c80;
    fStack_7c = (float)((ulong)uStack_c80 >> 0x20);
    local_48 = local_68 + local_88;
    fStack_44 = fStack_64 + fStack_84;
    fStack_40 = fStack_60 + fStack_80;
    fStack_3c = fStack_5c + fStack_7c;
    local_30 = &local_c68;
    local_1a0 = &local_cf8;
    local_1a8 = local_c58;
    local_1b8 = &local_c68;
    local_170 = &local_1c8;
    uVar5 = *puVar14;
    uVar6 = *(undefined8 *)(lVar12 + 0x28);
    local_108._0_4_ = (float)uVar5;
    local_108._4_4_ = (float)((ulong)uVar5 >> 0x20);
    uStack_100._0_4_ = (float)uVar6;
    uStack_100._4_4_ = (float)((ulong)uVar6 >> 0x20);
    local_148 = local_d08 * (float)local_108;
    fStack_144 = local_d08 * local_108._4_4_;
    fStack_140 = local_d08 * (float)uStack_100;
    fStack_13c = local_d08 * uStack_100._4_4_;
    local_130 = &local_1c8;
    local_158 = CONCAT44(fStack_144,local_148);
    uStack_150 = CONCAT44(fStack_13c,fStack_140);
    local_188 = &local_cf8;
    local_190 = &local_1c8;
    local_168 = (float)local_c68;
    fStack_164 = (float)((ulong)local_c68 >> 0x20);
    fStack_160 = (float)uStack_c60;
    fStack_15c = (float)((ulong)uStack_c60 >> 0x20);
    local_128 = local_148 + local_168;
    fStack_124 = fStack_144 + fStack_164;
    fStack_120 = fStack_140 + fStack_160;
    fStack_11c = fStack_13c + fStack_15c;
    local_110 = &local_cf8;
    local_448 = CONCAT44(fStack_124,local_128);
    uStack_440 = CONCAT44(fStack_11c,fStack_120);
    local_a98 = &pLVar16->dir;
    local_a88 = &local_ce8;
    local_a90 = &local_cf8;
    uVar7 = *(undefined8 *)&local_a98->field_0;
    uVar8 = *(undefined8 *)((long)&(pLVar16->dir).field_0 + 8);
    local_458._0_4_ = (float)uVar7;
    local_458._4_4_ = (float)((ulong)uVar7 >> 0x20);
    uStack_450._0_4_ = (float)uVar8;
    uStack_450._4_4_ = (float)((ulong)uVar8 >> 0x20);
    local_2d8 = local_128 + (float)local_458;
    fStack_2d4 = fStack_124 + local_458._4_4_;
    fStack_2d0 = fStack_120 + (float)uStack_450;
    fStack_2cc = fStack_11c + uStack_450._4_4_;
    local_2c0 = &local_ce8;
    local_ce8 = CONCAT44(fStack_2d4,local_2d8);
    uStack_ce0 = CONCAT44(fStack_2cc,fStack_2d0);
    local_c08 = &pLVar16->dir;
    local_c10 = &local_ce8;
    *(undefined8 *)&local_c08->field_0 = local_ce8;
    *(undefined8 *)((long)&(pLVar16->dir).field_0 + 8) = uStack_ce0;
    local_c48 = &local_d08;
    local_c40 = puVar14;
    local_458 = uVar7;
    uStack_450 = uVar8;
    local_268 = uVar1;
    uStack_260 = uVar2;
    local_1b0 = puVar14;
    local_198 = local_1b8;
    local_180 = puVar14;
    local_178 = local_1a8;
    local_108 = uVar5;
    uStack_100 = uVar6;
    local_b8 = local_d8;
    local_a0 = local_d0;
    local_98 = local_c8;
    local_28 = uVar3;
    uStack_20 = uVar4;
    local_cf8 = local_448;
    uStack_cf0 = uStack_440;
    local_c88 = CONCAT44(fStack_374,local_378);
    uStack_c80 = CONCAT44(fStack_36c,fStack_370);
    local_c68 = CONCAT44(fStack_44,local_48);
    uStack_c60 = CONCAT44(fStack_3c,fStack_40);
    local_1c8 = local_158;
    uStack_1c0 = uStack_150;
    local_e8 = local_78;
    uStack_e0 = uStack_70;
  }
  local_c18 = &pLVar16->dir;
  local_a30 = &local_b68;
  uVar1 = *(undefined8 *)&local_c18->field_0;
  uVar2 = *(undefined8 *)((long)&(pLVar16->dir).field_0 + 8);
  uVar3 = *(undefined8 *)&local_c18->field_0;
  uVar4 = *(undefined8 *)((long)&(pLVar16->dir).field_0 + 8);
  local_1d8._0_4_ = (float)uVar1;
  local_1d8._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_1d0._0_4_ = (float)uVar2;
  uStack_1d0._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_1e8._0_4_ = (float)uVar3;
  local_1e8._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_1e0._0_4_ = (float)uVar4;
  uStack_1e0._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_2f8 = (float)local_1d8 * (float)local_1e8;
  local_618 = local_1d8._4_4_ * local_1e8._4_4_;
  local_568 = (float)uStack_1d0 * (float)uStack_1e0;
  fStack_2ec = uStack_1d0._4_4_ * uStack_1e0._4_4_;
  local_7b8 = CONCAT44(local_618,local_2f8);
  uStack_7b0 = CONCAT44(fStack_2ec,local_568);
  local_7a8 = &local_878;
  local_788 = &local_888;
  local_678 = CONCAT44(local_618,local_618);
  uStack_670 = CONCAT44(local_618,local_618);
  local_768 = &local_898;
  local_588 = CONCAT44(local_568,local_568);
  uStack_580 = CONCAT44(local_568,local_568);
  local_6f8 = &local_8b8;
  local_6b8 = local_2f8 + local_618;
  fStack_6b4 = local_618 + local_618;
  fStack_6b0 = local_568 + local_618;
  fStack_6ac = fStack_2ec + local_618;
  local_4a8 = CONCAT44(fStack_6b4,local_6b8);
  uStack_4a0 = CONCAT44(fStack_6ac,fStack_6b0);
  local_6f0 = &local_8a8;
  local_d0c = local_6b8 + local_568;
  fStack_6e4 = fStack_6b4 + local_568;
  fStack_6e0 = fStack_6b0 + local_568;
  fStack_6dc = fStack_6ac + local_568;
  local_858 = CONCAT44(fStack_6e4,local_d0c);
  uStack_850 = CONCAT44(fStack_6dc,fStack_6e0);
  local_988 = ZEXT416((uint)local_d0c);
  local_ab8 = CONCAT44(0,local_d0c);
  uStack_ab0 = 0;
  uStack_290 = 0;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_ab8;
  local_ac8 = rsqrtss(auVar11,auVar11);
  local_98c = 0x3fc00000;
  local_9a8 = ZEXT416(0x3fc00000);
  local_8d8 = local_ac8._0_8_;
  uVar13 = local_8d8;
  uStack_8d0 = local_ac8._8_8_;
  local_8d8._0_4_ = local_ac8._0_4_;
  local_8c8 = (ulong)(uint)((float)local_8d8 * 1.5);
  uStack_8c0 = 0;
  local_9ac = 0xbf000000;
  local_9c8 = ZEXT416(0xbf000000);
  local_8f8 = local_9c8._0_8_;
  uStack_8f0 = 0;
  local_8e8 = (ulong)(uint)(local_d0c * -0.5);
  uStack_8e0 = 0;
  local_918 = local_ac8._0_8_;
  uStack_910 = local_ac8._8_8_;
  local_d10 = local_d0c * -0.5 * (float)local_8d8;
  local_908 = (ulong)(uint)local_d10;
  uStack_900 = 0;
  local_938 = local_ac8._0_8_;
  uStack_930 = local_ac8._8_8_;
  local_928 = CONCAT44(local_ac8._4_4_,(float)local_8d8 * (float)local_8d8);
  uStack_920 = local_ac8._8_8_;
  local_958 = local_928;
  uStack_950 = local_ac8._8_8_;
  local_d10 = local_d10 * (float)local_8d8 * (float)local_8d8;
  local_948 = (ulong)(uint)local_d10;
  uStack_940 = 0;
  local_288 = local_948;
  uStack_280 = 0;
  local_d10 = (float)local_8d8 * 1.5 + local_d10;
  local_278 = (ulong)(uint)local_d10;
  uStack_270 = 0;
  local_ad8 = local_278;
  uStack_ad0 = 0;
  local_968 = local_278;
  uStack_960 = 0;
  local_c20 = &local_d28;
  local_b38 = &local_bb8;
  local_228 = CONCAT44(local_d10,local_d10);
  uStack_220 = CONCAT44(local_d10,local_d10);
  uVar5 = *(undefined8 *)&local_c18->field_0;
  uVar6 = *(undefined8 *)((long)&(pLVar16->dir).field_0 + 8);
  local_218._0_4_ = (float)uVar5;
  local_218._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_210._0_4_ = (float)uVar6;
  uStack_210._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_338 = (float)local_218 * local_d10;
  fStack_334 = local_218._4_4_ * local_d10;
  fStack_330 = (float)uStack_210 * local_d10;
  fStack_32c = uStack_210._4_4_ * local_d10;
  local_d28 = CONCAT44(fStack_334,local_338);
  uStack_d20 = CONCAT44(fStack_32c,fStack_330);
  *(undefined8 *)&local_c18->field_0 = local_d28;
  *(undefined8 *)((long)&(pLVar16->dir).field_0 + 8) = uStack_d20;
  pLVar16->dist = local_d0c * local_d10;
  local_b70 = (undefined8 *)(local_cc0 + 0x40);
  local_a18 = &local_b88;
  uVar7 = *local_b70;
  uVar8 = *(undefined8 *)(local_cc0 + 0x48);
  uVar9 = *(undefined8 *)&local_c18->field_0;
  uVar10 = *(undefined8 *)((long)&(pLVar16->dir).field_0 + 8);
  local_1f8._0_4_ = (float)uVar7;
  local_1f8._4_4_ = (float)((ulong)uVar7 >> 0x20);
  uStack_1f0._0_4_ = (float)uVar8;
  uStack_1f0._4_4_ = (float)((ulong)uVar8 >> 0x20);
  local_208._0_4_ = (float)uVar9;
  local_208._4_4_ = (float)((ulong)uVar9 >> 0x20);
  uStack_200._0_4_ = (float)uVar10;
  uStack_200._4_4_ = (float)((ulong)uVar10 >> 0x20);
  local_318 = (float)local_1f8 * (float)local_208;
  local_628 = local_1f8._4_4_ * local_208._4_4_;
  local_508 = (float)uStack_1f0 * (float)uStack_200;
  fStack_30c = uStack_1f0._4_4_ * uStack_200._4_4_;
  local_7d8 = CONCAT44(local_628,local_318);
  uStack_7d0 = CONCAT44(fStack_30c,local_508);
  local_7c0 = &local_808;
  local_798 = &local_818;
  local_648 = CONCAT44(local_628,local_628);
  uStack_640 = CONCAT44(local_628,local_628);
  local_778 = &local_828;
  local_528 = CONCAT44(local_508,local_508);
  uStack_520 = CONCAT44(local_508,local_508);
  local_758 = &local_848;
  local_718 = local_318 + local_628;
  fStack_714 = local_628 + local_628;
  fStack_710 = local_508 + local_628;
  fStack_70c = fStack_30c + local_628;
  local_468 = CONCAT44(fStack_714,local_718);
  uStack_460 = CONCAT44(fStack_70c,fStack_710);
  local_750 = &local_838;
  local_748 = local_718 + local_508;
  fStack_744 = fStack_714 + local_508;
  fStack_740 = fStack_710 + local_508;
  fStack_73c = fStack_70c + local_508;
  local_7e8 = CONCAT44(fStack_744,local_748);
  uStack_7e0 = CONCAT44(fStack_73c,fStack_740);
  local_d2c = -local_748;
  local_d34 = (local_d2c - *(float *)(local_cc0 + 0x60)) * *(float *)(local_cc0 + 100);
  local_a58 = &zero;
  local_d38 = 0;
  local_a50 = &one;
  local_d3c = 0x3f800000;
  local_a68 = &local_d34;
  local_a70 = &local_d38;
  local_a78 = &local_d3c;
  local_a48 = 1.0;
  local_d7c = local_a48;
  if (local_d34 < 1.0) {
    local_d7c = local_d34;
  }
  local_a60 = 0.0;
  local_a5c = local_d7c;
  local_d80 = local_a60;
  if (0.0 <= local_d7c) {
    local_d80 = local_d7c;
  }
  local_d30 = local_d80;
  if (*(float *)(local_cc0 + 0x68) <= 0.0) {
    local_bf0 = &inf;
    local_b9c = local_d10;
    local_b98 = local_c18;
    local_b90 = local_c20;
    local_b78 = local_c18;
    local_b50 = local_c18;
    local_b48 = local_c18;
    local_b3c = local_d10;
    local_aa0 = local_d0c;
    local_a44 = local_d34;
    local_a40 = local_c18;
    local_a38 = local_c18;
    local_a28 = local_c18;
    local_a20 = local_b70;
    local_a10 = local_b38;
    local_a08 = local_c18;
    local_a00 = local_c20;
    local_96c = local_d0c;
    local_8d8 = uVar13;
    local_860 = local_a30;
    local_7f0 = local_a18;
    local_7a0 = local_7c0;
    local_790 = local_7a8;
    local_780 = local_7c0;
    local_770 = local_7a8;
    local_760 = local_778;
    local_738 = local_750;
    local_730 = local_798;
    local_728 = local_7c0;
    local_720 = local_758;
    local_708 = local_758;
    local_700 = local_768;
    local_6e8 = local_d0c;
    local_6d8 = local_6f0;
    local_6d0 = local_788;
    local_6c8 = local_7a8;
    local_6c0 = local_6f8;
    local_6a0 = local_6f8;
    local_698 = local_750;
    local_690 = local_6f0;
    local_688 = local_7a8;
    local_680 = local_788;
    local_660 = local_788;
    local_658 = local_7c0;
    local_650 = local_798;
    local_630 = local_798;
    fStack_624 = local_628;
    fStack_620 = local_628;
    fStack_61c = local_628;
    fStack_614 = local_618;
    fStack_610 = local_618;
    fStack_60c = local_618;
    local_608 = local_7d8;
    uStack_600 = uStack_7d0;
    local_5f8 = local_7b8;
    uStack_5f0 = uStack_7b0;
    local_5e8 = local_7c0;
    local_5e0 = local_7a8;
    local_5d8 = local_788;
    local_5d0 = local_7a8;
    local_5c8 = local_768;
    local_5c0 = local_6f8;
    local_5b8 = local_798;
    local_5b0 = local_7c0;
    local_5a8 = local_778;
    local_5a0 = local_758;
    local_598 = local_7a8;
    local_590 = local_768;
    local_570 = local_768;
    fStack_564 = local_568;
    fStack_560 = local_568;
    fStack_55c = local_568;
    local_558 = local_7b8;
    uStack_550 = uStack_7b0;
    local_540 = local_7a8;
    local_538 = local_7c0;
    local_530 = local_778;
    local_510 = local_778;
    fStack_504 = local_508;
    fStack_500 = local_508;
    fStack_4fc = local_508;
    local_4f8 = local_7d8;
    uStack_4f0 = uStack_7d0;
    local_4e0 = local_7c0;
    local_4d8 = local_678;
    uStack_4d0 = uStack_670;
    local_4c8 = local_7b8;
    uStack_4c0 = uStack_7b0;
    local_4b8 = local_588;
    uStack_4b0 = uStack_580;
    local_498 = local_648;
    uStack_490 = uStack_640;
    local_488 = local_7d8;
    uStack_480 = uStack_7d0;
    local_478 = local_528;
    uStack_470 = uStack_520;
    local_3b8 = local_d10;
    fStack_3b4 = local_d10;
    fStack_3b0 = local_d10;
    fStack_3ac = local_d10;
    local_39c = local_d10;
    local_320 = local_c20;
    fStack_314 = local_628;
    fStack_310 = local_508;
    local_300 = local_a18;
    fStack_2f4 = local_618;
    fStack_2f0 = local_568;
    local_2e0 = local_a30;
    local_298 = local_ab8;
    local_218 = uVar5;
    uStack_210 = uVar6;
    local_208 = uVar9;
    uStack_200 = uVar10;
    local_1f8 = uVar7;
    uStack_1f0 = uVar8;
    local_1e8 = uVar3;
    uStack_1e0 = uVar4;
    local_1d8 = uVar1;
    uStack_1d0 = uVar2;
    local_bb8 = local_228;
    uStack_bb0 = uStack_220;
    local_b88 = local_7d8;
    uStack_b80 = uStack_7d0;
    local_b68 = local_7b8;
    uStack_b60 = uStack_7b0;
    local_8b8 = local_4a8;
    uStack_8b0 = uStack_4a0;
    local_8a8 = local_858;
    uStack_8a0 = uStack_850;
    local_898 = local_588;
    uStack_890 = uStack_580;
    local_888 = local_678;
    uStack_880 = uStack_670;
    local_878 = local_7b8;
    uStack_870 = uStack_7b0;
    local_848 = local_468;
    uStack_840 = uStack_460;
    local_838 = local_7e8;
    uStack_830 = uStack_7e0;
    local_828 = local_528;
    uStack_820 = uStack_520;
    local_818 = local_648;
    uStack_810 = uStack_640;
    local_808 = local_7d8;
    uStack_800 = uStack_7d0;
    fVar15 = std::numeric_limits<float>::infinity();
    pLVar16->pdf = fVar15;
  }
  else {
    pLVar16->pdf = *(float *)(local_cc0 + 0x6c) * local_d0c * ABS(local_d2c);
  }
  local_d30 = local_d10 * local_d10 * local_d30;
  local_238 = (float)*(undefined8 *)(local_cc0 + 0x50);
  fStack_234 = (float)((ulong)*(undefined8 *)(local_cc0 + 0x50) >> 0x20);
  fStack_230 = (float)*(undefined8 *)(local_cc0 + 0x58);
  fStack_22c = (float)((ulong)*(undefined8 *)(local_cc0 + 0x58) >> 0x20);
  *(ulong *)&(pLVar16->weight).field_0 = CONCAT44(fStack_234 * local_d30,local_238 * local_d30);
  *(ulong *)((long)&(pLVar16->weight).field_0 + 8) =
       CONCAT44(fStack_22c * local_d30,fStack_230 * local_d30);
  return in_RDI;
}

Assistant:

SYCL_EXTERNAL Light_SampleRes SpotLight_sample(const Light* super,
                                                              const DifferentialGeometry& dg,
                                                              const Vec2f& s)
{
  const SpotLight* self = (SpotLight*)super;
  Light_SampleRes res;

  // extant light vector from the hit point
  res.dir = self->position - dg.P;

  if (self->radius > 0.0f)
    res.dir = self->frame * uniformSampleDisk(self->radius, s) + res.dir;

  const float dist2 = dot(res.dir, res.dir);
  const float invdist = rsqrt(dist2);

  // normalized light vector
  res.dir = res.dir * invdist;
  res.dist = dist2 * invdist;

  // cosine of the negated light direction and light vector.
  const float cosAngle = -dot(self->frame.vz, res.dir);
  const float angularAttenuation = clamp((cosAngle - self->cosAngleMax) * self->cosAngleScale);

  if (self->radius > 0.0f)
    res.pdf = self->diskPdf * dist2 * abs(cosAngle);
  else
    res.pdf = inf; // we always take this res

  // convert from power to radiance by attenuating by distance^2; attenuate by angle
  res.weight = self->power * (sqr(invdist) * angularAttenuation);

  return res;
}